

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

void bssl::dtls1_update_mtu(SSL *ssl)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  BIO *pBVar4;
  long lVar5;
  long mtu;
  SSL *ssl_local;
  
  uVar3 = ssl->d1->mtu;
  uVar1 = dtls1_min_mtu();
  if ((uVar3 < uVar1) && (uVar2 = SSL_get_options(ssl), (uVar2 & 0x1000) == 0)) {
    pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&ssl->wbio);
    lVar5 = BIO_ctrl(pBVar4,0x28,0,(void *)0x0);
    if ((-1 < lVar5) && (lVar5 < 0x40000001)) {
      uVar3 = dtls1_min_mtu();
      if (uVar3 <= (uint)lVar5) {
        ssl->d1->mtu = (uint)lVar5;
        goto LAB_001d87ad;
      }
    }
    ssl->d1->mtu = 0x5c0;
    pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&ssl->wbio);
    BIO_ctrl(pBVar4,0x2a,(ulong)ssl->d1->mtu,(void *)0x0);
  }
LAB_001d87ad:
  uVar3 = ssl->d1->mtu;
  uVar1 = dtls1_min_mtu();
  if (uVar3 < uVar1) {
    __assert_fail("ssl->d1->mtu >= dtls1_min_mtu()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x293,"void bssl::dtls1_update_mtu(SSL *)");
  }
  return;
}

Assistant:

static void dtls1_update_mtu(SSL *ssl) {
  // TODO(davidben): No consumer implements |BIO_CTRL_DGRAM_SET_MTU| and the
  // only |BIO_CTRL_DGRAM_QUERY_MTU| implementation could use
  // |SSL_set_mtu|. Does this need to be so complex?
  if (ssl->d1->mtu < dtls1_min_mtu() &&
      !(SSL_get_options(ssl) & SSL_OP_NO_QUERY_MTU)) {
    long mtu = BIO_ctrl(ssl->wbio.get(), BIO_CTRL_DGRAM_QUERY_MTU, 0, NULL);
    if (mtu >= 0 && mtu <= (1 << 30) && (unsigned)mtu >= dtls1_min_mtu()) {
      ssl->d1->mtu = (unsigned)mtu;
    } else {
      ssl->d1->mtu = kDefaultMTU;
      BIO_ctrl(ssl->wbio.get(), BIO_CTRL_DGRAM_SET_MTU, ssl->d1->mtu, NULL);
    }
  }

  // The MTU should be above the minimum now.
  assert(ssl->d1->mtu >= dtls1_min_mtu());
}